

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3.cpp
# Opt level: O1

Vector3 * __thiscall Vector3::reflect(Vector3 *this,Vector3 *n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector3 *in_RDI;
  double dVar5;
  
  dVar1 = this->y;
  dVar2 = n->y;
  dVar3 = this->z;
  dVar4 = n->z;
  dVar5 = dVar3 * dVar4 + this->x * n->x + dVar1 * dVar2;
  dVar5 = dVar5 + dVar5;
  in_RDI->x = this->x - n->x * dVar5;
  in_RDI->y = dVar1 - dVar2 * dVar5;
  in_RDI->z = dVar3 - dVar5 * dVar4;
  return in_RDI;
}

Assistant:

Vector3 Vector3::reflect(const Vector3& n) const
{
    return *this - n * (2 * this->dot(n));
}